

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

int re2::PCRE::GlobalReplace(string *str,PCRE *pattern,StringPiece *rewrite)

{
  int iVar1;
  StringPiece *rewrite_00;
  int iVar2;
  ulong uVar3;
  StringPiece local_170;
  int local_160;
  int local_15c;
  int matchend;
  int matchstart;
  StringPiece local_138;
  int local_124;
  bool local_11d;
  int matches;
  string local_118 [3];
  bool last_match_was_empty_string;
  int start;
  string out;
  int local_f8;
  int local_f4;
  int vec [51];
  int count;
  StringPiece *rewrite_local;
  PCRE *pattern_local;
  string *str_local;
  
  vec[0x31] = 0;
  unique0x10000278 = rewrite;
  memset(&local_f8,0,0xcc);
  std::__cxx11::string::string(local_118);
  matches = 0;
  local_11d = false;
  while (iVar1 = matches, iVar2 = std::__cxx11::string::size(), iVar1 <= iVar2) {
    if ((local_11d & 1U) == 0) {
      StringPiece::StringPiece((StringPiece *)&matchend,str);
      local_124 = TryMatch(pattern,(StringPiece *)&matchend,matches,UNANCHORED,true,&local_f8,0x33);
      if (local_124 < 1) break;
LAB_0015d247:
      local_15c = local_f8;
      local_160 = local_f4;
      if (local_f8 < matches) {
        __assert_fail("matchstart >= start",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                      ,0x1a3,
                      "static int re2::PCRE::GlobalReplace(string *, const PCRE &, const StringPiece &)"
                     );
      }
      if (local_f4 < local_f8) {
        __assert_fail("matchend >= matchstart",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                      ,0x1a4,
                      "static int re2::PCRE::GlobalReplace(string *, const PCRE &, const StringPiece &)"
                     );
      }
      std::__cxx11::string::append(local_118,(ulong)str,(long)matches);
      rewrite_00 = stack0xffffffffffffffd8;
      StringPiece::StringPiece(&local_170,str);
      Rewrite(pattern,(string *)local_118,rewrite_00,&local_170,&local_f8,local_124);
      matches = local_160;
      vec[0x31] = vec[0x31] + 1;
      local_11d = local_15c == local_160;
    }
    else {
      StringPiece::StringPiece(&local_138,str);
      local_124 = TryMatch(pattern,&local_138,matches,ANCHOR_START,false,&local_f8,0x33);
      iVar1 = matches;
      if (0 < local_124) goto LAB_0015d247;
      iVar2 = std::__cxx11::string::size();
      if (iVar1 < iVar2) {
        std::__cxx11::string::operator[]((ulong)str);
        std::__cxx11::string::push_back((char)local_118);
      }
      matches = matches + 1;
      local_11d = false;
    }
  }
  iVar1 = matches;
  if (vec[0x31] == 0) {
    str_local._4_4_ = 0;
  }
  else {
    iVar2 = std::__cxx11::string::size();
    if (iVar1 < iVar2) {
      uVar3 = (ulong)matches;
      std::__cxx11::string::size();
      std::__cxx11::string::append(local_118,(ulong)str,uVar3);
    }
    std::swap<char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,str);
    str_local._4_4_ = vec[0x31];
  }
  std::__cxx11::string::~string(local_118);
  return str_local._4_4_;
}

Assistant:

int PCRE::GlobalReplace(string *str,
                      const PCRE& pattern,
                      const StringPiece& rewrite) {
  int count = 0;
  int vec[kVecSize] = {};
  string out;
  int start = 0;
  bool last_match_was_empty_string = false;

  while (start <= static_cast<int>(str->size())) {
    // If the previous match was for the empty string, we shouldn't
    // just match again: we'll match in the same way and get an
    // infinite loop.  Instead, we do the match in a special way:
    // anchored -- to force another try at the same position --
    // and with a flag saying that this time, ignore empty matches.
    // If this special match returns, that means there's a non-empty
    // match at this position as well, and we can continue.  If not,
    // we do what perl does, and just advance by one.
    // Notice that perl prints '@@@' for this;
    //    perl -le '$_ = "aa"; s/b*|aa/@/g; print'
    int matches;
    if (last_match_was_empty_string) {
      matches = pattern.TryMatch(*str, start, ANCHOR_START, false,
                                 vec, kVecSize);
      if (matches <= 0) {
        if (start < static_cast<int>(str->size()))
          out.push_back((*str)[start]);
        start++;
        last_match_was_empty_string = false;
        continue;
      }
    } else {
      matches = pattern.TryMatch(*str, start, UNANCHORED, true,
                                 vec, kVecSize);
      if (matches <= 0)
        break;
    }
    int matchstart = vec[0], matchend = vec[1];
    assert(matchstart >= start);
    assert(matchend >= matchstart);

    out.append(*str, start, matchstart - start);
    pattern.Rewrite(&out, rewrite, *str, vec, matches);
    start = matchend;
    count++;
    last_match_was_empty_string = (matchstart == matchend);
  }

  if (count == 0)
    return 0;

  if (start < static_cast<int>(str->size()))
    out.append(*str, start, static_cast<int>(str->size()) - start);
  swap(out, *str);
  return count;
}